

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O2

void __thiscall
luna::SemanticAnalysisVisitor::Visit(SemanticAnalysisVisitor *this,ParamList *par_list,void *data)

{
  SyntaxTree *pSVar1;
  NameListData name_list_data;
  size_t local_20;
  
  pSVar1 = (par_list->name_list_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  if (pSVar1 != (SyntaxTree *)0x0) {
    local_20 = 0;
    (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&local_20);
    par_list->fix_arg_count_ = local_20;
  }
  if (par_list->vararg_ == true) {
    this->current_function_->has_vararg = true;
  }
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(ParamList *par_list, void *data)
    {
        if (par_list->name_list_)
        {
            NameListData name_list_data;
            par_list->name_list_->Accept(this, &name_list_data);
            par_list->fix_arg_count_ = name_list_data.name_count_;
        }

        if (par_list->vararg_)
            SetFunctionVararg();
    }